

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTBITDec2(octet *val,octet *der,size_t count,u32 tag,size_t len)

{
  undefined4 in_ECX;
  long in_RDI;
  size_t *in_R8;
  size_t l;
  octet *v;
  undefined4 in_stack_ffffffffffffffb8;
  u32 in_stack_ffffffffffffffbc;
  void *in_stack_ffffffffffffffc0;
  byte *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  size_t local_8;
  
  local_8 = derDec2((octet **)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,
                    in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffbc);
  if (local_8 == 0xffffffffffffffff) {
    local_8 = 0xffffffffffffffff;
  }
  else if ((((in_stack_ffffffffffffffc0 == (void *)0x0) || (7 < *in_stack_ffffffffffffffc8)) ||
           ((*in_stack_ffffffffffffffc8 != 0 && (in_stack_ffffffffffffffc0 == (void *)0x1)))) ||
          (((long)in_stack_ffffffffffffffc0 + -1) * 8 !=
           (long)in_R8 + (ulong)*in_stack_ffffffffffffffc8)) {
    local_8 = 0xffffffffffffffff;
  }
  else if (in_RDI != 0) {
    memMove(in_stack_ffffffffffffffc0,
            (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0x124590);
  }
  return local_8;
}

Assistant:

size_t derTBITDec2(octet* val, const octet der[], size_t count, u32 tag,
	size_t len)
{
	const octet* v;
	size_t l;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// число битов дополнения больше 7?
	// биты дополнения в несуществующем октете?
	// длина не соответствует ожидаемой?
	if (l < 1 || v[0] > 7 || v[0] != 0 && l == 1 || (l - 1) * 8 != len + v[0])
		return SIZE_MAX;
	// возвратить строку
	if (val)
		memMove(val, v + 1, l - 1);
	return count;
}